

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-stack.c
# Opt level: O2

void write_cb(uv_write_t *req,int status)

{
  FILE *__stream;
  char *pcVar1;
  undefined8 uStack_20;
  
  __stream = _stderr;
  if (req == (uv_write_t *)0x0) {
    pcVar1 = "req != NULL";
    uStack_20 = 0x65;
  }
  else {
    if (status == 0) {
      bytes_sent_done = bytes_sent_done + 0x2728000;
      write_cb_called = write_cb_called + 1;
      return;
    }
    pcVar1 = uv_strerror(status);
    fprintf(__stream,"uv_write error: %s\n",pcVar1);
    pcVar1 = "0";
    uStack_20 = 0x69;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
          ,uStack_20,pcVar1);
  abort();
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  int r;

  ASSERT(status == 0);
  ASSERT(nested == 0 && "write_cb must be called from a fresh stack");

  puts("Data written. 500ms timeout...");

  /* After the data has been sent, we're going to wait for a while, then start
   * reading. This makes us certain that the message has been echoed back to
   * our receive buffer when we start reading. This maximizes the temptation
   * for the backend to use dirty stack for calling read_cb. */
  nested++;
  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, timer_cb, 500, 0);
  ASSERT(r == 0);
  nested--;

  write_cb_called++;
}